

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

xml_attribute __thiscall
NULLCPugiXML::xml_node__prepend_attribute(NULLCPugiXML *this,NULLCArray name,xml_node *ptr)

{
  xml_node *ptr_local;
  NULLCArray name_local;
  xml_attribute ret;
  
  name_local.ptr._0_4_ = name.ptr._0_4_;
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("name is empty");
    memset((void *)((long)&name_local.ptr + 4),0,8);
    xml_attribute::xml_attribute((xml_attribute *)((long)&name_local.ptr + 4));
  }
  else {
    xml_attribute::xml_attribute((xml_attribute *)((long)&name_local.ptr + 4));
    name_local._4_8_ =
         pugi::xml_node::prepend_attribute
                   ((xml_node *)CONCAT44((int)((ulong)register0x00000010 >> 0x20),name.len),
                    (char_t *)this);
  }
  return (xml_attribute)(xml_attribute)name_local._4_8_;
}

Assistant:

xml_attribute xml_node__prepend_attribute(NULLCArray name, xml_node* ptr)
	{
		if(!name.ptr)
		{
			nullcThrowError("name is empty");
			return xml_attribute();
		}
		xml_attribute ret;
		ret.attribute = ptr->node.prepend_attribute(name.ptr);
		return ret;
	}